

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefileCall::cmMakefileCall
          (cmMakefileCall *this,cmMakefile *mf,cmListFileContext *lfc,cmExecutionStatus *status)

{
  undefined1 local_38 [8];
  CallStackEntry entry;
  cmExecutionStatus *status_local;
  cmListFileContext *lfc_local;
  cmMakefile *mf_local;
  cmMakefileCall *this_local;
  
  this->Makefile = mf;
  local_38 = (undefined1  [8])lfc;
  entry.Context = (cmListFileContext *)status;
  entry.Status = status;
  std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>::push_back
            (&this->Makefile->CallStack,(value_type *)local_38);
  return;
}

Assistant:

cmMakefileCall::cmMakefileCall(cmMakefile* mf, const cmListFileContext& lfc,
                               cmExecutionStatus& status): Makefile(mf)
{
  cmMakefile::CallStackEntry entry = {&lfc, &status};
  this->Makefile->CallStack.push_back(entry);
}